

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O2

void __thiscall
randomx::JitCompilerX86::generateProgramPrologue
          (JitCompilerX86 *this,Program *prog,ProgramConfiguration *pcfg)

{
  pointer piVar1;
  uint8_t *puVar2;
  uint64_t uVar3;
  int iVar4;
  long lVar5;
  uint i;
  Instruction *instr;
  
  piVar1 = (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  for (lVar5 = 6; lVar5 != 0xe; lVar5 = lVar5 + 1) {
    this->registerUsage[lVar5 + -6] = -1;
  }
  lVar5 = (long)prologueSize;
  this->codePos = prologueSize;
  puVar2 = this->code;
  uVar3 = pcfg->eMask[1];
  *(uint64_t *)(puVar2 + lVar5 + -0x30) = pcfg->eMask[0];
  *(uint64_t *)((long)(puVar2 + lVar5 + -0x30) + 8) = uVar3;
  iVar4 = loopLoadSize;
  memcpy(this->code + this->codePos,codeLoopLoad,(long)loopLoadSize);
  this->codePos = this->codePos + iVar4;
  instr = prog->programBuffer;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    instr->src = instr->src & 7;
    instr->dst = instr->dst & 7;
    generateCode(this,instr,(int)lVar5);
    instr = instr + 1;
  }
  puVar2 = this->code;
  iVar4 = this->codePos;
  (puVar2 + iVar4)[0] = 'A';
  (puVar2 + iVar4)[1] = 0x8b;
  iVar4 = this->codePos + 2;
  this->codePos = iVar4;
  this->code[iVar4] = (char)pcfg->readReg2 + 0xc0;
  iVar4 = this->codePos;
  this->codePos = iVar4 + 1;
  puVar2 = this->code;
  (puVar2 + (long)iVar4 + 1)[0] = 'A';
  (puVar2 + (long)iVar4 + 1)[1] = '3';
  iVar4 = this->codePos + 2;
  this->codePos = iVar4;
  this->code[iVar4] = (char)pcfg->readReg3 + 0xc0;
  this->codePos = this->codePos + 1;
  return;
}

Assistant:

void JitCompilerX86::generateProgramPrologue(Program& prog, ProgramConfiguration& pcfg) {
		instructionOffsets.clear();
		for (unsigned i = 0; i < RegistersCount; ++i) {
			registerUsage[i] = -1;
		}

		codePos = prologueSize;
		memcpy(code + codePos - 48, &pcfg.eMask, sizeof(pcfg.eMask));
		memcpy(code + codePos, codeLoopLoad, loopLoadSize);
		codePos += loopLoadSize;
		for (unsigned i = 0; i < prog.getSize(); ++i) {
			Instruction& instr = prog(i);
			instr.src %= RegistersCount;
			instr.dst %= RegistersCount;
			generateCode(instr, i);
		}
		emit(REX_MOV_RR);
		emitByte(0xc0 + pcfg.readReg2);
		emit(REX_XOR_EAX);
		emitByte(0xc0 + pcfg.readReg3);
	}